

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::setCompleter(QLineEdit *this,QCompleter *c)

{
  bool bVar1;
  QLineEditPrivate *widget;
  QCompleter *pQVar2;
  QObject *pQVar3;
  QWidget *pQVar4;
  QCompleter *in_RSI;
  QObject *in_RDI;
  QLineEditPrivate *d;
  QLineEditPrivate *in_stack_00000048;
  QLineEditPrivate *in_stack_00000050;
  QCompleter *in_stack_ffffffffffffffc8;
  QWidgetLineControl *in_stack_ffffffffffffffd0;
  QCompleter *this_00;
  
  widget = d_func((QLineEdit *)0x5c4241);
  this_00 = in_RSI;
  pQVar2 = QWidgetLineControl::completer((QWidgetLineControl *)0x5c4261);
  if (this_00 != pQVar2) {
    pQVar2 = QWidgetLineControl::completer((QWidgetLineControl *)0x5c4284);
    if (pQVar2 != (QCompleter *)0x0) {
      QLineEditPrivate::disconnectCompleter(in_stack_00000050);
      QWidgetLineControl::completer((QWidgetLineControl *)0x5c42a5);
      QCompleter::setWidget(this_00,(QWidget *)widget);
      QWidgetLineControl::completer((QWidgetLineControl *)0x5c42c2);
      pQVar3 = QObject::parent((QObject *)0x5c42ca);
      if ((pQVar3 == in_RDI) &&
         (in_stack_ffffffffffffffd0 =
               (QWidgetLineControl *)QWidgetLineControl::completer((QWidgetLineControl *)0x5c42e5),
         in_stack_ffffffffffffffd0 != (QWidgetLineControl *)0x0)) {
        (**(code **)(*(long *)in_stack_ffffffffffffffd0 + 0x20))();
      }
    }
    QWidgetLineControl::setCompleter(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (in_RSI != (QCompleter *)0x0) {
      pQVar4 = QCompleter::widget((QCompleter *)in_stack_ffffffffffffffd0);
      if (pQVar4 == (QWidget *)0x0) {
        QCompleter::setWidget(this_00,(QWidget *)widget);
      }
      bVar1 = QWidget::hasFocus((QWidget *)widget);
      if (bVar1) {
        QLineEditPrivate::connectCompleter(in_stack_00000048);
      }
    }
  }
  return;
}

Assistant:

void QLineEdit::setCompleter(QCompleter *c)
{
    Q_D(QLineEdit);
    if (c == d->control->completer())
        return;
    if (d->control->completer()) {
        d->disconnectCompleter();
        d->control->completer()->setWidget(nullptr);
        if (d->control->completer()->parent() == this)
            delete d->control->completer();
    }
    d->control->setCompleter(c);
    if (!c)
        return;
    if (c->widget() == nullptr)
        c->setWidget(this);
    if (hasFocus())
        d->connectCompleter();
}